

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1495::run(TestCase1495 *this)

{
  PointerType PVar1;
  Builder root;
  MallocMessageBuilder builder;
  PointerReader local_178;
  PointerBuilder local_158;
  WirePointer *local_140;
  ushort local_134;
  int local_130;
  StructBuilder local_120 [2];
  StructBuilder in_stack_ffffffffffffff50;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_120 + 1),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_178,(MessageBuilder *)(local_120 + 1));
  local_158.pointer = local_178.pointer;
  local_158.segment = (SegmentBuilder *)local_178.segment;
  local_158.capTable = (CapTableBuilder *)local_178.capTable;
  PointerBuilder::initStruct(local_120,&local_158,(StructSize)0x140006);
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  local_158.pointer = local_120[0].pointers;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5dc,ERROR,"\"failed: expected \" \"!(root.hasTextField())\"",
               (char (*) [40])"failed: expected !(root.hasTextField())");
  }
  local_158.pointer = local_120[0].pointers + 1;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5dd,ERROR,"\"failed: expected \" \"!(root.hasDataField())\"",
               (char (*) [40])"failed: expected !(root.hasDataField())");
  }
  local_158.pointer = local_120[0].pointers + 2;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5de,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
  }
  local_158.pointer = local_120[0].pointers + 7;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5df,ERROR,"\"failed: expected \" \"!(root.hasInt32List())\"",
               (char (*) [40])"failed: expected !(root.hasInt32List())");
  }
  StructBuilder::asReader(local_120);
  if (local_134 == 0) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.pointer = local_140;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e1,ERROR,"\"failed: expected \" \"!(root.asReader().hasTextField())\"",
               (char (*) [51])"failed: expected !(root.asReader().hasTextField())");
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 2) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 1;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e2,ERROR,"\"failed: expected \" \"!(root.asReader().hasDataField())\"",
               (char (*) [51])"failed: expected !(root.asReader().hasDataField())");
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 3) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 2;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[53]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e3,ERROR,"\"failed: expected \" \"!(root.asReader().hasStructField())\"",
               (char (*) [53])"failed: expected !(root.asReader().hasStructField())");
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 8) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 7;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e4,ERROR,"\"failed: expected \" \"!(root.asReader().hasInt32List())\"",
               (char (*) [51])"failed: expected !(root.asReader().hasInt32List())");
  }
  initTestMessage((Builder)in_stack_ffffffffffffff50);
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  local_158.pointer = local_120[0].pointers;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e8,ERROR,"\"failed: expected \" \"root.hasTextField()\"",
               (char (*) [37])"failed: expected root.hasTextField()");
  }
  local_158.pointer = local_120[0].pointers + 1;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5e9,ERROR,"\"failed: expected \" \"root.hasDataField()\"",
               (char (*) [37])"failed: expected root.hasDataField()");
  }
  local_158.pointer = local_120[0].pointers + 2;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ea,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
               (char (*) [39])"failed: expected root.hasStructField()");
  }
  local_158.pointer = local_120[0].pointers + 7;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5eb,ERROR,"\"failed: expected \" \"root.hasInt32List()\"",
               (char (*) [37])"failed: expected root.hasInt32List()");
  }
  StructBuilder::asReader(local_120);
  if (local_134 == 0) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.pointer = local_140;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ed,ERROR,"\"failed: expected \" \"root.asReader().hasTextField()\"",
               (char (*) [48])"failed: expected root.asReader().hasTextField()");
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 2) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 1;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ee,ERROR,"\"failed: expected \" \"root.asReader().hasDataField()\"",
               (char (*) [48])"failed: expected root.asReader().hasDataField()");
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 3) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 2;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5ef,ERROR,"\"failed: expected \" \"root.asReader().hasStructField()\"",
               (char (*) [50])"failed: expected root.asReader().hasStructField()");
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 8) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 7;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x5f0,ERROR,"\"failed: expected \" \"root.asReader().hasInt32List()\"",
               (char (*) [48])"failed: expected root.asReader().hasInt32List()");
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_120 + 1));
  return;
}

Assistant:

TEST(Encoding, Has) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_FALSE(root.hasTextField());
  EXPECT_FALSE(root.hasDataField());
  EXPECT_FALSE(root.hasStructField());
  EXPECT_FALSE(root.hasInt32List());

  EXPECT_FALSE(root.asReader().hasTextField());
  EXPECT_FALSE(root.asReader().hasDataField());
  EXPECT_FALSE(root.asReader().hasStructField());
  EXPECT_FALSE(root.asReader().hasInt32List());

  initTestMessage(root);

  EXPECT_TRUE(root.hasTextField());
  EXPECT_TRUE(root.hasDataField());
  EXPECT_TRUE(root.hasStructField());
  EXPECT_TRUE(root.hasInt32List());

  EXPECT_TRUE(root.asReader().hasTextField());
  EXPECT_TRUE(root.asReader().hasDataField());
  EXPECT_TRUE(root.asReader().hasStructField());
  EXPECT_TRUE(root.asReader().hasInt32List());
}